

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_init_quantizer(EncQuantDequantParams *enc_quant_dequant_params,
                       CommonQuantParams *quant_params,aom_bit_depth_t bit_depth,int sharpness)

{
  _Bool _Var1;
  DeltaQuantParams *prev_deltaq_params_00;
  int in_ECX;
  int in_EDX;
  CommonQuantParams *in_RSI;
  long in_RDI;
  QUANTS *unaff_retaddr;
  Dequants *in_stack_00000008;
  int in_stack_00000010;
  Dequants *dequants;
  QUANTS *quants;
  DeltaQuantParams *prev_deltaq_params;
  
  prev_deltaq_params_00 = (DeltaQuantParams *)(in_RDI + 0x15000);
  in_RSI->sharpness = in_ECX;
  _Var1 = deltaq_params_have_changed(prev_deltaq_params_00,in_RSI);
  if (_Var1) {
    av1_build_quantizer((aom_bit_depth_t)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX,in_ECX,
                        (int)((ulong)prev_deltaq_params_00 >> 0x20),(int)prev_deltaq_params_00,
                        unaff_retaddr,in_stack_00000008,in_stack_00000010);
    prev_deltaq_params_00->y_dc_delta_q = in_RSI->y_dc_delta_q;
    prev_deltaq_params_00->u_dc_delta_q = in_RSI->u_dc_delta_q;
    prev_deltaq_params_00->v_dc_delta_q = in_RSI->v_dc_delta_q;
    prev_deltaq_params_00->u_ac_delta_q = in_RSI->u_ac_delta_q;
    prev_deltaq_params_00->v_ac_delta_q = in_RSI->v_ac_delta_q;
    prev_deltaq_params_00->sharpness = in_ECX;
  }
  return;
}

Assistant:

void av1_init_quantizer(EncQuantDequantParams *const enc_quant_dequant_params,
                        CommonQuantParams *quant_params,
                        aom_bit_depth_t bit_depth, int sharpness) {
  DeltaQuantParams *const prev_deltaq_params =
      &enc_quant_dequant_params->prev_deltaq_params;
  quant_params->sharpness = sharpness;

  // Re-initialize the quantizer only if any of the dc/ac deltaq parameters
  // change.
  if (!deltaq_params_have_changed(prev_deltaq_params, quant_params)) return;
  QUANTS *const quants = &enc_quant_dequant_params->quants;
  Dequants *const dequants = &enc_quant_dequant_params->dequants;
  av1_build_quantizer(bit_depth, quant_params->y_dc_delta_q,
                      quant_params->u_dc_delta_q, quant_params->u_ac_delta_q,
                      quant_params->v_dc_delta_q, quant_params->v_ac_delta_q,
                      quants, dequants, sharpness);

  // Record the state of deltaq parameters.
  prev_deltaq_params->y_dc_delta_q = quant_params->y_dc_delta_q;
  prev_deltaq_params->u_dc_delta_q = quant_params->u_dc_delta_q;
  prev_deltaq_params->v_dc_delta_q = quant_params->v_dc_delta_q;
  prev_deltaq_params->u_ac_delta_q = quant_params->u_ac_delta_q;
  prev_deltaq_params->v_ac_delta_q = quant_params->v_ac_delta_q;
  prev_deltaq_params->sharpness = sharpness;
}